

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_ptr_array.c
# Opt level: O0

int zt_ptr_array_cat(zt_ptr_array *dst,zt_ptr_array *src)

{
  int iVar1;
  zt_ptr_array *in_RSI;
  zt_ptr_array *in_RDI;
  int32_t i;
  zt_ptr_array *array;
  int local_1c;
  int local_4;
  
  if ((in_RDI == (zt_ptr_array *)0x0) || (in_RSI == (zt_ptr_array *)0x0)) {
    local_4 = -1;
  }
  else {
    for (local_1c = 0; local_1c < in_RSI->count; local_1c = local_1c + 1) {
      array = in_RDI;
      zt_ptr_array_get_idx(in_RSI,local_1c);
      iVar1 = zt_ptr_array_add(array,(void *)0x107b81);
      if (iVar1 != 0) {
        return -1;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
zt_ptr_array_cat(zt_ptr_array * dst, zt_ptr_array * src) {
    int32_t i;

    if (dst == NULL || src == NULL) {
        return -1;
    }

    for (i = 0; i < src->count; i++) {
        if (zt_ptr_array_add(dst, zt_ptr_array_get_idx(src, i))) {
            return -1;
        }
    }

    return 0;
}